

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int balance(BtCursor *pCur)

{
  void *__dest;
  Pgno *pPVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  ushort uVar6;
  u8 *puVar7;
  MemPage *pMVar8;
  PgHdr *pPVar9;
  u16 *puVar10;
  u8 uVar11;
  u8 uVar12;
  i64 iVar13;
  u16 uVar14;
  u16 uVar15;
  ushort uVar16;
  int iVar17;
  u32 uVar18;
  int iVar19;
  void *pvVar20;
  MemPage **ppMVar21;
  Pgno PVar22;
  uint uVar23;
  long lVar24;
  undefined1 *puVar25;
  long lVar26;
  uint uVar27;
  undefined4 *puVar28;
  MemPage *pMVar29;
  MemPage **ppMVar30;
  MemPage *pMVar31;
  char cVar32;
  uint uVar33;
  int iVar34;
  int nCell;
  u8 *puVar35;
  ulong uVar36;
  MemPage *pMVar37;
  int iFirst;
  ulong uVar38;
  MemPage **ppMVar39;
  MemPage *pMVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  ulong uVar45;
  u8 *puVar46;
  MemPage *pPage;
  BtShared *pBVar47;
  long lVar48;
  size_t __n;
  bool bVar49;
  int local_28c;
  MemPage *local_288;
  ulong local_280;
  ulong local_278;
  MemPage *local_270;
  MemPage *local_268;
  BtCursor *local_260;
  char local_251;
  MemPage *local_250;
  MemPage *local_248;
  MemPage *local_240;
  BtShared *local_238;
  MemPage **local_230;
  MemPage *local_228;
  MemPage *local_220;
  Pgno local_214;
  undefined8 local_210;
  Pgno pgnoNew;
  uint local_204 [5];
  MemPage *local_1f0;
  MemPage *apOld [3];
  int szNew [5];
  u8 abDone [5];
  char local_1a0;
  void *local_180;
  CellInfo local_170;
  MemPage *pNew;
  MemPage *local_150 [4];
  ulong local_130;
  MemPage *local_128;
  uint local_120;
  uint local_11c;
  u16 szCell;
  MemPage *pChild;
  MemPage *local_f8;
  MemPage **local_f0;
  MemPage *local_e8;
  u8 *local_e0 [5];
  uint auStack_b4 [7];
  Pgno aPgOrder [5];
  long lStack_80;
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  MemPage *pMVar44;
  
  local_11c = (pCur->pBt->usableSize * 2) / 3;
  cVar32 = pCur->iPage;
  local_180 = (void *)0x0;
  pPage = pCur->pPage;
  local_260 = pCur;
LAB_00146948:
  if ((pPage->nFree < 0) && (iVar17 = btreeComputeFreeSpace(pPage), iVar17 != 0)) {
LAB_00148362:
    iVar17 = 0;
  }
  else {
    if (cVar32 != '\0') {
      if ((pPage->nOverflow == '\0') && (pPage->nFree <= (int)local_11c)) goto LAB_00148362;
      pMVar40 = pCur->apPage[(long)cVar32 + -1];
      uVar16 = pCur->aiIdx[(long)cVar32 + -1];
      iVar17 = sqlite3PagerWrite(pMVar40->pDbPage);
      pvVar20 = local_180;
      if ((iVar17 == 0) &&
         ((local_251 = cVar32, -1 < pMVar40->nFree ||
          (iVar17 = btreeComputeFreeSpace(pMVar40), iVar17 == 0)))) {
        if ((pPage->intKeyLeaf != '\0') &&
           ((((pPage->nOverflow == '\x01' && (pPage->aiOvfl[0] == pPage->nCell)) &&
             (pMVar40->pgno != 1)) && (pMVar40->nCell == uVar16)))) {
          if (pPage->aiOvfl[0] == 0) {
            iVar17 = sqlite3CorruptError(0x1130a);
          }
          else {
            pBVar47 = pPage->pBt;
            iVar17 = allocateBtreePage(pBVar47,&pNew,&pgnoNew,0,'\0');
            if (iVar17 == 0) {
              apOld[0] = (MemPage *)pPage->apOvfl[0];
              szCell = (*pPage->xCellSize)(pPage,(u8 *)apOld[0]);
              pMVar44 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
              zeroPage(pMVar44,0xd);
              pChild = (MemPage *)CONCAT44(pChild._4_4_,1);
              local_f0 = apOld;
              local_e8 = (MemPage *)&szCell;
              local_e0[0] = pPage->aDataEnd;
              auStack_b4[1] = 2;
              local_f8 = pPage;
              iVar17 = rebuildPage((CellArray *)&pChild,0,1,pMVar44);
              local_170.nKey = CONCAT44(local_170.nKey._4_4_,iVar17);
              if (iVar17 == 0) {
                pMVar44->nFree =
                     (pBVar47->usableSize - ((uint)szCell + (uint)pMVar44->cellOffset)) + -2;
                if ((pBVar47->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar47,pgnoNew,'\x05',pMVar40->pgno,(int *)&local_170),
                   pMVar44->minLocal < szCell)) {
                  ptrmapPutOvflPtr(pMVar44,pMVar44,&apOld[0]->isInit,(int *)&local_170);
                }
                uVar36 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                          pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                pPage->maskPage);
                uVar38 = 0;
                puVar7 = pPage->aData + uVar36;
                pMVar31 = (MemPage *)(pPage->aData + uVar36 + 2);
                do {
                  pMVar37 = pMVar31;
                  puVar35 = puVar7;
                  if (7 < uVar38) break;
                  uVar38 = uVar38 + 1;
                  puVar7 = puVar35 + 1;
                  pMVar31 = (MemPage *)&pMVar37->bBusy;
                } while ((char)*puVar35 < '\0');
                lVar26 = 4;
                do {
                  apOld[0] = pMVar37;
                  uVar4 = *(u8 *)((long)&apOld[0][-1].xParseCell + 7);
                  aBalanceQuickSpace[lVar26] = uVar4;
                  lVar26 = lVar26 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar37 = (MemPage *)&apOld[0]->bBusy;
                } while (apOld[0] < (MemPage *)(puVar35 + 10));
                if ((int)local_170.nKey == 0) {
                  insertCell(pMVar40,(uint)pMVar40->nCell,aBalanceQuickSpace,(int)lVar26,(u8 *)0x0,
                             pPage->pgno,(int *)&local_170);
                }
                *(Pgno *)(pMVar40->aData + (ulong)pMVar40->hdrOffset + 8) =
                     pgnoNew >> 0x18 | (pgnoNew & 0xff0000) >> 8 | (pgnoNew & 0xff00) << 8 |
                     pgnoNew << 0x18;
                iVar17 = (int)local_170.nKey;
              }
              releasePage(pMVar44);
            }
          }
          goto LAB_001475a8;
        }
        pvVar20 = pcache1Alloc(pCur->pBt->pageSize);
        abDone[0] = '\0';
        abDone[1] = '\0';
        abDone[2] = '\0';
        abDone[3] = '\0';
        pChild = (MemPage *)((ulong)pChild & 0xffffffff00000000);
        local_f0 = (MemPage **)0x0;
        abDone[4] = '\0';
        iVar17 = 7;
        if (pvVar20 != (void *)0x0) {
          uVar41 = pCur->hints & 1;
          uVar42 = (uint)pMVar40->nCell + (uint)pMVar40->nOverflow;
          local_278 = 0;
          if (1 < uVar42) {
            uVar27 = (uint)uVar16;
            if (uVar27 == 0) {
              local_278 = 0;
            }
            else if (uVar42 == uVar27) {
              local_278 = (ulong)((uVar16 + uVar41) - 2);
            }
            else {
              local_278 = (ulong)(uVar27 - 1);
            }
            uVar42 = 2 - uVar41;
          }
          pMVar44 = (MemPage *)(ulong)uVar42;
          uVar27 = ((int)local_278 - (uint)pMVar40->nOverflow) + uVar42;
          puVar7 = pMVar40->aData;
          if (uVar27 == pMVar40->nCell) {
            uVar36 = (ulong)pMVar40->hdrOffset + 8;
          }
          else {
            uVar36 = (ulong)(CONCAT11(pMVar40->aCellIdx[(long)(int)uVar27 * 2],
                                      pMVar40->aCellIdx[(long)(int)uVar27 * 2 + 1]) &
                            pMVar40->maskPage);
          }
          pBVar47 = pMVar40->pBt;
          local_230 = (MemPage **)CONCAT44(local_230._4_4_,uVar42 + 1);
          uVar18 = sqlite3Get4byte(puVar7 + uVar36);
          local_268 = (MemPage *)CONCAT44(local_268._4_4_,uVar18);
          __n = (size_t)(uVar42 * 8);
          uVar42 = (int)local_278 + -1 + uVar42;
          local_270 = (MemPage *)(szNew + (long)((long)&pMVar44[-1].xParseCell + 7));
          local_248 = pMVar44;
          local_238 = pBVar47;
          local_128 = pMVar44;
          while( true ) {
            local_28c = getAndInitPage(pBVar47,(Pgno)local_268,(MemPage **)((long)apOld + __n),
                                       (BtCursor *)0x0,0);
            pMVar31 = (MemPage *)((ulong)local_230 & 0xffffffff);
            if (local_28c != 0) break;
            pMVar37 = *(MemPage **)((long)apOld + __n);
            if ((pMVar37->nFree < 0) && (local_28c = btreeComputeFreeSpace(pMVar37), local_28c != 0)
               ) goto LAB_00146ed6;
            local_250 = pMVar31;
            if (__n == 0) {
              local_214 = (Pgno)local_268;
              uVar42 = ((pBVar47->pageSize - 8) / 6 + 4) * (uint)local_230 + 3 & 0xfffffffc;
              ppMVar21 = (MemPage **)sqlite3Malloc((long)(int)(uVar42 * 10 + pBVar47->pageSize));
              local_f0 = ppMVar21;
              if (ppMVar21 != (MemPage **)0x0) {
                lVar26 = (long)(int)uVar42;
                local_210 = (MemPage *)(ppMVar21 + lVar26);
                local_e8 = local_210;
                puVar10 = local_210->aiOvfl;
                local_f8 = apOld[0];
                bVar2 = apOld[0]->leaf;
                local_280 = (ulong)bVar2 << 2;
                local_1f0 = apOld[0];
                local_268 = (MemPage *)(ulong)apOld[0]->intKeyLeaf;
                local_228 = (MemPage *)(lVar26 * 10 + (long)ppMVar21);
                pMVar29 = (MemPage *)0x0;
                iVar17 = 0;
                pMVar37 = (MemPage *)0x0;
                local_240 = pMVar40;
                goto LAB_00146fb3;
              }
              local_28c = 7;
              pCur = local_260;
              goto LAB_00147504;
            }
            local_248 = (MemPage *)((long)&local_248[-1].xParseCell + 7);
            uVar27 = uVar42;
            if (pMVar40->nOverflow == 0) {
LAB_00146e06:
              local_288 = (MemPage *)CONCAT44(local_288._4_4_,uVar42);
              lVar26 = (long)(int)(uVar27 - pMVar40->nOverflow);
              puVar35 = pMVar40->aData +
                        (CONCAT11(pMVar40->aCellIdx[lVar26 * 2],pMVar40->aCellIdx[lVar26 * 2 + 1]) &
                        pMVar40->maskPage);
              *(u8 **)((long)&lStack_80 + __n) = puVar35;
              uVar18 = sqlite3Get4byte(puVar35);
              local_268 = (MemPage *)CONCAT44(local_268._4_4_,uVar18);
              uVar14 = (*pMVar40->xCellSize)(pMVar40,puVar35);
              uVar42 = (uint)uVar14;
              local_270->isInit = (char)uVar42;
              local_270->bBusy = (char)(uVar42 >> 8);
              local_270->intKey = (char)(uVar42 >> 0x10);
              local_270->intKeyLeaf = (char)(uVar42 >> 0x18);
              if ((pBVar47->btsFlags & 0xc) != 0) {
                iVar17 = (int)puVar35 - *(int *)&pMVar40->aData;
                if ((int)pBVar47->usableSize < (int)(iVar17 + (uint)uVar14)) {
                  local_28c = sqlite3CorruptError(0x1146f);
                  memset(apOld,0,__n);
                  pCur = local_260;
                  pMVar31 = local_250;
                  uVar42 = 0;
                  iVar17 = local_28c;
                  goto LAB_0014752c;
                }
                memcpy((void *)((long)iVar17 + (long)pvVar20),puVar35,(ulong)uVar42);
                *(long *)((long)&lStack_80 + __n) =
                     ((long)puVar35 - (long)pMVar40->aData) + (long)pvVar20;
                pBVar47 = local_238;
              }
              dropCell(pMVar40,uVar27 - pMVar40->nOverflow,(uint)uVar14,&local_28c);
              uVar42 = (uint)local_288;
            }
            else {
              if (uVar42 != pMVar40->aiOvfl[0]) {
                uVar27 = (int)local_278 + (int)local_248;
                goto LAB_00146e06;
              }
              puVar35 = pMVar40->apOvfl[0];
              *(u8 **)((long)&lStack_80 + __n) = puVar35;
              uVar18 = sqlite3Get4byte(puVar35);
              local_268 = (MemPage *)CONCAT44(local_268._4_4_,uVar18);
              uVar14 = (*pMVar40->xCellSize)(pMVar40,puVar35);
              uVar27 = (uint)uVar14;
              local_270->isInit = (char)uVar27;
              local_270->bBusy = (char)(uVar27 >> 8);
              local_270->intKey = (char)(uVar27 >> 0x10);
              local_270->intKeyLeaf = (char)(uVar27 >> 0x18);
              pMVar40->nOverflow = '\0';
            }
            __n = __n - 8;
            uVar42 = uVar42 - 1;
            local_270 = (MemPage *)((long)&local_270[-1].xParseCell + 4);
          }
          __n = __n + 8;
LAB_00146ed6:
          memset(apOld,0,__n);
          pCur = local_260;
          uVar42 = 0;
          iVar17 = local_28c;
          goto LAB_0014752c;
        }
        goto LAB_00147586;
      }
      goto LAB_001475a8;
    }
    if (pPage->nOverflow == '\0') goto LAB_00148362;
    pChild = (MemPage *)0x0;
    apOld[0] = (MemPage *)((ulong)apOld[0] & 0xffffffff00000000);
    pBVar47 = pPage->pBt;
    iVar17 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar17 == 0) {
      pNew._0_4_ = allocateBtreePage(pBVar47,&pChild,(Pgno *)apOld,pPage->pgno,'\0');
      pMVar40 = pChild;
      copyNodeContent(pPage,pChild,(int *)&pNew);
      if (pBVar47->autoVacuum != '\0') {
        ptrmapPut(pBVar47,(Pgno)apOld[0],'\x05',pPage->pgno,(int *)&pNew);
      }
      iVar17 = (int)pNew;
      if ((int)pNew != 0) goto LAB_0014836d;
      memcpy(pMVar40->aiOvfl,pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
      memcpy(pMVar40->apOvfl,pPage->apOvfl,(ulong)pPage->nOverflow << 3);
      pMVar40->nOverflow = pPage->nOverflow;
      zeroPage(pPage,*pMVar40->aData & 0xfffffff7);
      *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
           (Pgno)apOld[0] >> 0x18 | ((Pgno)apOld[0] & 0xff0000) >> 8 |
           ((Pgno)apOld[0] & 0xff00) << 8 | (Pgno)apOld[0] << 0x18;
      pCur->apPage[1] = pMVar40;
      pCur->iPage = '\x01';
      pCur->ix = 0;
      pCur->aiIdx[0] = 0;
      pCur->apPage[0] = pPage;
      iVar17 = 0;
      cVar32 = '\x01';
      goto LAB_001475cd;
    }
    pMVar40 = (MemPage *)0x0;
LAB_0014836d:
    pCur->apPage[1] = (MemPage *)0x0;
    releasePage(pMVar40);
  }
  goto LAB_0014837e;
LAB_00146fb3:
  local_220 = (MemPage *)(local_280 & 0xffff);
  if (pMVar29 == pMVar31) goto LAB_00147268;
  pMVar40 = apOld[(long)pMVar29];
  puVar35 = pMVar40->aData;
  if (*puVar35 != *local_1f0->aData) {
    iVar17 = 0x114b1;
    goto LAB_001474fb;
  }
  uVar16 = pMVar40->maskPage;
  puVar46 = puVar35 + pMVar40->cellOffset;
  uVar38 = (ulong)iVar17;
  local_288 = pMVar37;
  local_270 = pMVar40;
  local_248 = pMVar29;
  memset(local_210->aiOvfl + (uVar38 - 0xe),0,
         (ulong)(((uint)pMVar40->nOverflow + (uint)pMVar40->nCell) * 2));
  bVar3 = local_270->nOverflow;
  if ((ulong)bVar3 != 0) {
    uVar42 = (uint)local_270->aiOvfl[0];
    lVar24 = uVar38 << 0x20;
    ppMVar30 = ppMVar21 + uVar38;
    while (bVar49 = uVar42 != 0, uVar42 = uVar42 - 1, bVar49) {
      ppMVar21[uVar38] = (MemPage *)(puVar35 + (CONCAT11(*puVar46,puVar46[1]) & uVar16));
      puVar46 = puVar46 + 2;
      uVar38 = uVar38 + 1;
      lVar24 = lVar24 + 0x100000000;
      iVar17 = iVar17 + 1;
      ppMVar30 = ppMVar30 + 1;
    }
    for (uVar38 = 0; bVar3 != uVar38; uVar38 = uVar38 + 1) {
      *ppMVar30 = (MemPage *)local_270->apOvfl[uVar38];
      lVar24 = lVar24 + 0x100000000;
      iVar17 = iVar17 + 1;
      ppMVar30 = ppMVar30 + 1;
    }
    pChild = (MemPage *)CONCAT44(pChild._4_4_,iVar17);
    uVar38 = lVar24 >> 0x20;
  }
  uVar5 = local_270->cellOffset;
  uVar6 = local_270->nCell;
  lVar24 = uVar38 << 0x20;
  for (; puVar46 < puVar35 + (ulong)uVar6 * 2 + (ulong)uVar5; puVar46 = puVar46 + 2) {
    ppMVar21[uVar38] = (MemPage *)(puVar35 + (uVar16 & CONCAT11(*puVar46,puVar46[1])));
    uVar38 = uVar38 + 1;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,(int)uVar38);
    lVar24 = lVar24 + 0x100000000;
  }
  *(int *)(&szCell + (long)local_248 * 2) = (int)uVar38;
  pMVar37 = local_288;
  if ((local_248 < pMVar44) && ((char)local_268 == '\0')) {
    uVar42 = szNew[(long)local_248] & 0xffff;
    lVar48 = lVar24 >> 0x1f;
    *(short *)((long)local_210->aiOvfl + lVar48 + -0x1c) = (short)szNew[(long)local_248];
    __dest = (void *)((long)(puVar10 + lVar26 + -0xe) + (long)(int)local_288);
    uVar27 = (int)local_288 + uVar42;
    pMVar37 = (MemPage *)(ulong)uVar27;
    memcpy(__dest,apDiv[(long)local_248],(ulong)uVar42);
    puVar28 = (undefined4 *)((long)__dest + local_280);
    *(undefined4 **)((long)ppMVar21 + (lVar24 >> 0x1d)) = puVar28;
    local_220._0_4_ = (uint)*(ushort *)((long)local_210->aiOvfl + lVar48 + -0x1c) - (int)local_220;
    *(short *)((long)local_210->aiOvfl + lVar48 + -0x1c) = (short)(int)local_220;
    if (local_270->leaf == '\0') {
      *puVar28 = *(undefined4 *)(local_270->aData + 8);
    }
    else {
      puVar25 = (undefined1 *)((long)local_228->aiOvfl + (long)(int)uVar27 + -0x1c);
      while ((ushort)(int)local_220 < 4) {
        *puVar25 = 0;
        local_220._0_4_ = local_210->aiOvfl[(lVar24 >> 0x20) + -0xe] + 1;
        local_210->aiOvfl[(lVar24 >> 0x20) + -0xe] = (u16)(int)local_220;
        pMVar37 = (MemPage *)(ulong)((int)pMVar37 + 1);
        puVar25 = puVar25 + 1;
      }
    }
    uVar42 = (int)uVar38 + 1;
    uVar38 = (ulong)uVar42;
    pChild = (MemPage *)CONCAT44(pChild._4_4_,uVar42);
  }
  pMVar29 = (MemPage *)&local_248->bBusy;
  iVar17 = (int)uVar38;
  pMVar31 = local_250;
  pBVar47 = local_238;
  goto LAB_00146fb3;
LAB_00147268:
  local_248 = (MemPage *)
              CONCAT44(local_248._4_4_,pBVar47->usableSize + (uint)(ushort)local_280 + -0xc);
  iVar17 = 0;
  for (pMVar40 = (MemPage *)0x0; pMVar40 != pMVar31; pMVar40 = (MemPage *)&pMVar40->bBusy) {
    pMVar31 = apOld[(long)pMVar40];
    local_e0[iVar17] = pMVar31->aDataEnd;
    uVar42 = *(uint *)(&szCell + (long)pMVar40 * 2);
    auStack_b4[(long)iVar17 + 1] = uVar42;
    if (iVar17 == 0) {
      iVar43 = 0;
    }
    else {
      iVar43 = iVar17 + -1;
      if (uVar42 != auStack_b4[iVar17]) {
        iVar43 = iVar17;
      }
    }
    iVar17 = iVar43;
    if ((Pgno)local_268 == 0) {
      iVar17 = iVar43 + 1;
      local_e0[(long)iVar43 + 1] = local_240->aDataEnd;
      aPgOrder[(long)iVar43 + -5] = uVar42 + 1;
    }
    iVar43 = (int)local_248 - pMVar31->nFree;
    szNew[(long)pMVar40] = iVar43;
    for (uVar38 = 0; uVar38 < pMVar31->nOverflow; uVar38 = uVar38 + 1) {
      uVar14 = (*pMVar31->xCellSize)(pMVar31,pMVar31->apOvfl[uVar38]);
      iVar43 = iVar43 + (uint)uVar14 + 2;
      szNew[(long)pMVar40] = iVar43;
    }
    local_204[(long)((long)&pMVar40[-1].xParseCell + 7)] = uVar42;
    iVar17 = iVar17 + 1;
    pMVar31 = local_250;
  }
  local_270 = (MemPage *)CONCAT44(local_270._4_4_,pChild._0_4_);
  pMVar40 = (MemPage *)((ulong)local_230 & 0xffffffff);
  pMVar37 = (MemPage *)0x0;
LAB_0014735a:
  do {
    if ((long)(int)pMVar40 <= (long)pMVar37) {
      local_130 = (ulong)((int)pMVar40 - 1);
      local_288 = local_e8;
      local_280 = (long)local_e8 - (ulong)(uint)((int)local_268 * 2);
      uVar38 = local_130;
      local_228 = pMVar40;
      break;
    }
    iVar17 = szNew[(long)pMVar37];
    local_288 = (MemPage *)&pMVar37->bBusy;
    local_280 = CONCAT44(local_280._4_4_,(int)pMVar37 + 2);
    for (; (int)local_248 < iVar17; iVar17 = iVar17 - (uVar14 + 2)) {
      if ((int)pMVar40 <= (int)(uint)local_288) {
        if ((MemPage *)0x3 < pMVar37) {
          szNew[(long)pMVar37] = iVar17;
          iVar17 = sqlite3CorruptError(0x11529);
          pCur = local_260;
          pMVar31 = local_250;
          uVar42 = 0;
          goto LAB_0014752c;
        }
        szNew[(long)&pMVar37->bBusy] = 0;
        local_204[(long)pMVar37] = (uint)local_270;
        pMVar40 = (MemPage *)(local_280 & 0xffffffff);
      }
      uVar42 = local_204[(long)((long)&pMVar37[-1].xParseCell + 7)];
      uVar14 = cachedCellSize((CellArray *)&pChild,uVar42 - 1);
      iVar43 = uVar14 + 2;
      if ((Pgno)local_268 == 0) {
        iVar43 = 0;
        if ((int)uVar42 < (int)(uint)local_270) {
          uVar15 = cachedCellSize((CellArray *)&pChild,uVar42);
          iVar43 = uVar15 + 2;
        }
      }
      szNew[(long)&pMVar37->bBusy] = szNew[(long)&pMVar37->bBusy] + iVar43;
      local_204[(long)((long)&pMVar37[-1].xParseCell + 7)] = uVar42 - 1;
    }
    szNew[(long)pMVar37] = iVar17;
    uVar42 = local_204[(long)((long)&pMVar37[-1].xParseCell + 7)];
    while ((int)uVar42 < (int)(uint)local_270) {
      uVar16 = cachedCellSize((CellArray *)&pChild,uVar42);
      pMVar31 = local_250;
      iVar17 = iVar17 + (uint)uVar16 + 2;
      if ((int)local_248 < iVar17) {
        local_204[(long)((long)&pMVar37[-1].xParseCell + 7)] = uVar42;
        if (pMVar37 == (MemPage *)0x0) {
          iVar17 = 0;
        }
        else {
          iVar17 = *(int *)((long)&local_210 + (long)pMVar37 * 4 + 4);
        }
        pMVar37 = local_288;
        if (iVar17 < (int)uVar42) goto LAB_0014735a;
        iVar17 = sqlite3CorruptError(0x1154a);
        pCur = local_260;
        uVar42 = 0;
        goto LAB_0014752c;
      }
      uVar42 = uVar42 + 1;
      szNew[(long)pMVar37] = iVar17;
      if ((Pgno)local_268 == 0) {
        iVar43 = 0;
        if ((int)uVar42 < (int)(uint)local_270) {
          uVar16 = cachedCellSize((CellArray *)&pChild,uVar42);
          goto LAB_00147483;
        }
      }
      else {
LAB_00147483:
        iVar43 = uVar16 + 2;
      }
      szNew[(long)&pMVar37->bBusy] = szNew[(long)&pMVar37->bBusy] - iVar43;
    }
    local_204[(long)((long)&pMVar37[-1].xParseCell + 7)] = uVar42;
    pMVar40 = local_288;
    pMVar37 = local_288;
    pMVar31 = local_250;
  } while( true );
  do {
    pMVar40 = local_240;
    local_1a0 = (char)uVar41;
    if ((int)uVar38 < 1) {
      local_280 = CONCAT44(local_280._4_4_,(uint)*local_1f0->aData);
      pMVar29 = (MemPage *)0x0;
      pMVar37 = (MemPage *)((ulong)local_228 & 0xffffffff);
      if ((int)local_228 < 1) {
        pMVar37 = pMVar29;
      }
      uVar41 = 0;
      local_228 = pMVar37;
      goto LAB_001478e6;
    }
    iVar17 = szNew[uVar38 - 1];
    iVar43 = szNew[uVar38];
    iVar19 = *(int *)((long)&local_210 + uVar38 * 4 + 4);
    uVar45 = (ulong)iVar19;
    cachedCellSize((CellArray *)&pChild,iVar19 - (Pgno)local_268);
    local_210 = (MemPage *)(ulong)((uint)(uVar38 == local_130) * 2 - 2);
    lVar26 = uVar45 + 1;
    do {
      uVar42 = (uint)uVar45;
      uVar27 = uVar42 - 1;
      uVar45 = (ulong)uVar27;
      cachedCellSize((CellArray *)&pChild,uVar27);
      if (iVar43 == 0) {
        uVar16 = local_288->aiOvfl[lVar26 + -0x10];
        iVar19 = *(ushort *)((local_280 - 2) + lVar26 * 2) + 2;
      }
      else {
        if (local_1a0 != '\0') break;
        iVar19 = (uint)*(ushort *)((local_280 - 2) + lVar26 * 2) + iVar43 + 2;
        uVar16 = local_288->aiOvfl[lVar26 + -0x10];
        if ((int)(((int)local_210 + iVar17) - (uint)uVar16) < iVar19) break;
      }
      iVar43 = iVar19;
      iVar17 = (iVar17 - (uint)uVar16) + -2;
      local_204[uVar38 - 2] = uVar27;
      lVar26 = lVar26 + -1;
      uVar42 = uVar27;
    } while (1 < lVar26);
    szNew[uVar38] = iVar43;
    szNew[uVar38 - 1] = iVar17;
    uVar27 = 0;
    if (uVar38 != 1) {
      uVar27 = local_204[(ulong)((int)uVar38 - 2) - 1];
    }
    uVar38 = uVar38 - 1;
    pMVar31 = local_250;
  } while ((int)uVar27 < (int)uVar42);
  iVar17 = 0x11574;
LAB_001474fb:
  pCur = local_260;
  local_28c = sqlite3CorruptError(iVar17);
LAB_00147504:
  uVar42 = 0;
  iVar17 = local_28c;
LAB_0014752c:
  local_28c = iVar17;
  sqlite3DbFree((sqlite3 *)0x0,local_f0);
  for (pMVar40 = (MemPage *)0x0; pMVar31 != pMVar40; pMVar40 = (MemPage *)&pMVar40->bBusy) {
    releasePage(apOld[(long)pMVar40]);
  }
  if ((int)uVar42 < 1) {
    uVar42 = 0;
  }
  for (uVar36 = 0; iVar17 = local_28c, uVar42 != uVar36; uVar36 = uVar36 + 1) {
    releasePage(local_150[uVar36 - 1]);
  }
LAB_00147586:
  if (local_180 != (void *)0x0) {
    pcache1Free(local_180);
  }
LAB_001475a8:
  local_180 = pvVar20;
  pPage->nOverflow = '\0';
  releasePage(pPage);
  cVar32 = pCur->iPage + -1;
  pCur->iPage = cVar32;
  pMVar40 = pCur->apPage[cVar32];
LAB_001475cd:
  pCur->pPage = pMVar40;
  pPage = pMVar40;
  if (iVar17 != 0) {
LAB_0014837e:
    if (local_180 != (void *)0x0) {
      pcache1Free(local_180);
    }
    return iVar17;
  }
  goto LAB_00146948;
LAB_001478e6:
  pBVar47 = local_238;
  pCur = local_260;
  uVar42 = uVar41;
  if (pMVar37 == pMVar29) goto LAB_001479d5;
  if (pMVar44 < pMVar29) {
    PVar22 = 1;
    if (local_1a0 == '\0') {
      PVar22 = local_214;
    }
    local_28c = allocateBtreePage(local_238,(MemPage **)&local_170,&local_214,PVar22,'\0');
    iVar13 = local_170.nKey;
    pCur = local_260;
    iVar17 = local_28c;
    if (local_28c != 0) goto LAB_0014752c;
    zeroPage((MemPage *)local_170.nKey,(int)local_280);
    local_150[(long)((long)&pMVar29[-1].xParseCell + 7)] = (MemPage *)iVar13;
    *(uint *)(&szCell + (long)pMVar29 * 2) = (uint)local_270;
    pMVar37 = local_228;
    if (pBVar47->autoVacuum != '\0') {
      ptrmapPut(pBVar47,*(Pgno *)(iVar13 + 4),'\x05',pMVar40->pgno,&local_28c);
      pMVar37 = local_228;
      goto joined_r0x001479c1;
    }
  }
  else {
    pMVar8 = apOld[(long)pMVar29];
    local_150[(long)((long)&pMVar29[-1].xParseCell + 7)] = pMVar8;
    apOld[(long)pMVar29] = (MemPage *)0x0;
    local_28c = sqlite3PagerWrite(pMVar8->pDbPage);
joined_r0x001479c1:
    pCur = local_260;
    uVar42 = uVar41 + 1;
    iVar17 = local_28c;
    if (local_28c != 0) goto LAB_0014752c;
  }
  uVar41 = uVar41 + 1;
  pMVar29 = (MemPage *)&pMVar29->bBusy;
  goto LAB_001478e6;
LAB_001479d5:
  pMVar40 = (MemPage *)0x0;
  if (0 < (int)uVar41) {
    pMVar40 = (MemPage *)(ulong)uVar41;
  }
  for (pMVar37 = (MemPage *)0x0; pMVar37 != pMVar40; pMVar37 = (MemPage *)&pMVar37->bBusy) {
    pMVar29 = local_150[(long)((long)&pMVar37[-1].xParseCell + 7)];
    PVar22 = pMVar29->pgno;
    aPgno[(long)pMVar37] = PVar22;
    aPgOrder[(long)pMVar37] = PVar22;
    aPgFlags[(long)pMVar37] = pMVar29->pDbPage->flags;
    pMVar29 = (MemPage *)0x0;
    while (pMVar37 != pMVar29) {
      pPVar1 = aPgno + (long)pMVar29;
      pMVar29 = (MemPage *)&pMVar29->bBusy;
      if (*pPVar1 == PVar22) {
        iVar17 = sqlite3CorruptError(0x115be);
        goto LAB_0014752c;
      }
    }
  }
  PVar22 = local_214;
  local_210 = pMVar40;
  for (pMVar31 = (MemPage *)0x0; pMVar31 != pMVar40; pMVar31 = (MemPage *)&pMVar31->bBusy) {
    pMVar37 = (MemPage *)0x0;
    uVar38 = 1;
    while( true ) {
      lVar26 = (long)(int)pMVar37;
      if (uVar41 == uVar38) break;
      pMVar29 = (MemPage *)(uVar38 & 0xffffffff);
      if (aPgOrder[lVar26] <= aPgOrder[uVar38]) {
        pMVar29 = pMVar37;
      }
      pMVar37 = pMVar29;
      uVar38 = uVar38 + 1;
    }
    PVar22 = aPgOrder[lVar26];
    aPgOrder[lVar26] = 0xffffffff;
    if (pMVar31 != pMVar37) {
      if ((long)pMVar31 < lVar26) {
        pPVar9 = local_150[lVar26 + -1]->pDbPage;
        uVar18 = local_238->nPage;
        pPVar9->flags = 0;
        sqlite3PcacheMove(pPVar9,uVar18 + (int)pMVar37 + 1);
      }
      pMVar40 = local_150[(long)((long)&pMVar31[-1].xParseCell + 7)];
      pPVar9 = pMVar40->pDbPage;
      pPVar9->flags = aPgFlags[lVar26];
      sqlite3PcacheMove(pPVar9,PVar22);
      pMVar40->pgno = PVar22;
      pMVar40 = local_210;
    }
  }
  lVar24 = (long)(int)uVar41;
  lVar26 = *(long *)(&local_170.nPayload + lVar24 * 2);
  uVar27 = *(uint *)(lVar26 + 4);
  *(uint *)(puVar7 + uVar36) =
       uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 | uVar27 << 0x18;
  if (((local_280 & 8) == 0) && ((uint)local_230 != uVar41)) {
    ppMVar21 = apOld;
    if ((int)(uint)local_230 < (int)uVar41) {
      ppMVar21 = &pNew;
    }
    *(undefined4 *)(*(long *)(lVar26 + 0x50) + 8) =
         *(undefined4 *)(ppMVar21[(long)pMVar44]->aData + 8);
  }
  local_214 = PVar22;
  if (local_238->autoVacuum != '\0') {
    bVar49 = (Pgno)local_268 == 0;
    pMVar40 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew);
    uVar27 = (uint)pMVar40->nOverflow + (uint)pMVar40->nCell;
    iVar17 = 0;
    lVar26 = 0;
    local_288 = pMVar40;
    for (uVar36 = 0; (long)uVar36 < (long)(int)(uint)local_270; uVar36 = uVar36 + 1) {
      pMVar31 = local_f0[uVar36];
      lVar48 = (long)(int)lVar26;
      lVar26 = lVar26 << 0x20;
      ppMVar21 = apOld + lVar48 + 1;
      ppMVar30 = local_150 + lVar48;
      for (; uVar36 == uVar27;
          uVar27 = uVar27 + bVar49 + (uint)pMVar40->nCell + (uint)pMVar40->nOverflow) {
        lVar48 = lVar48 + 1;
        ppMVar39 = ppMVar21;
        if (lVar48 < lVar24) {
          ppMVar39 = ppMVar30;
        }
        pMVar40 = *ppMVar39;
        lVar26 = lVar26 + 0x100000000;
        ppMVar21 = ppMVar21 + 1;
        ppMVar30 = ppMVar30 + 1;
      }
      iVar43 = iVar17;
      if (uVar36 == local_204[(long)iVar17 + -1]) {
        iVar43 = iVar17 + 1;
        local_288 = local_150[iVar17];
        iVar17 = iVar43;
        if ((Pgno)local_268 != 0) goto LAB_00147c4e;
      }
      else {
LAB_00147c4e:
        if (((((int)uVar41 <= (int)lVar48) ||
             (local_288->pgno != *(Pgno *)((long)aPgno + (lVar26 >> 0x1e)))) ||
            (pMVar31 < (MemPage *)pMVar40->aData)) ||
           (iVar17 = iVar43, (MemPage *)pMVar40->aDataEnd <= pMVar31)) {
          local_230 = (MemPage **)CONCAT44(local_230._4_4_,iVar43);
          local_270 = pMVar31;
          if (bVar2 == 0) {
            uVar18 = sqlite3Get4byte(&pMVar31->isInit);
            ptrmapPut(local_238,uVar18,'\x05',local_288->pgno,&local_28c);
          }
          uVar14 = cachedCellSize((CellArray *)&pChild,(int)uVar36);
          if (local_288->minLocal < uVar14) {
            ptrmapPutOvflPtr(local_288,pMVar40,&local_270->isInit,&local_28c);
          }
          pCur = local_260;
          pMVar31 = local_250;
          iVar17 = local_28c;
          if (local_28c != 0) goto LAB_0014752c;
          local_270 = (MemPage *)CONCAT44(local_270._4_4_,pChild._0_4_);
          iVar17 = (uint)local_230;
        }
      }
      lVar26 = lVar48;
    }
    local_288 = local_e8;
  }
  local_230 = local_f0;
  uVar38 = 0;
  uVar36 = (ulong)(uVar41 - 1);
  if ((int)(uVar41 - 1) < 1) {
    uVar36 = uVar38;
  }
  uVar45 = local_278 & 0xffffffff;
  iVar43 = 0;
  local_280 = uVar36;
  local_278 = uVar45;
  for (; uVar36 != uVar38; uVar38 = uVar38 + 1) {
    pMVar40 = local_150[uVar38 - 1];
    lVar26 = (long)(int)local_204[uVar38 - 1];
    pMVar31 = local_230[lVar26];
    uVar27 = (int)local_220 + (uint)local_288->aiOvfl[lVar26 + -0xe];
    pMVar37 = (MemPage *)((long)iVar43 + (long)pvVar20);
    if (pMVar40->leaf == '\0') {
      puVar7 = pMVar40->aData;
      uVar4 = pMVar31->bBusy;
      uVar11 = pMVar31->intKey;
      uVar12 = pMVar31->intKeyLeaf;
      puVar7[8] = pMVar31->isInit;
      puVar7[9] = uVar4;
      puVar7[10] = uVar11;
      puVar7[0xb] = uVar12;
    }
    else if ((Pgno)local_268 == 0) {
      pMVar31 = (MemPage *)((long)&pMVar31[-1].xParseCell + 4);
      if (local_288->aiOvfl[lVar26 + -0xe] == 4) {
        uVar14 = (*local_240->xCellSize)(local_240,(u8 *)pMVar31);
        uVar27 = (uint)uVar14;
        uVar45 = local_278;
        uVar36 = local_280;
      }
    }
    else {
      (*pMVar40->xParseCell)(pMVar40,&local_230[lVar26 + -1]->isInit,&local_170);
      iVar17 = sqlite3PutVarint((uchar *)&pMVar37->pgno,local_170.nKey);
      uVar27 = iVar17 + 4;
      pMVar31 = pMVar37;
      pMVar37 = (MemPage *)0x0;
      uVar45 = local_278;
    }
    insertCell(local_240,(int)uVar38 + (int)uVar45,&pMVar31->isInit,uVar27,&pMVar37->isInit,
               pMVar40->pgno,&local_28c);
    pCur = local_260;
    pMVar31 = local_250;
    iVar17 = local_28c;
    if (local_28c != 0) goto LAB_0014752c;
    iVar43 = iVar43 + uVar27;
  }
  bVar49 = (Pgno)local_268 == 0;
  uVar27 = -uVar41;
  local_120 = pgnoNew;
  local_268 = local_f8;
  pMVar40 = local_128;
LAB_00147e90:
  do {
    pMVar31 = local_210;
    uVar27 = uVar27 + 1;
    if ((int)uVar41 <= (int)uVar27) break;
    uVar23 = -uVar27;
    if (0 < (int)uVar27) {
      uVar23 = uVar27;
    }
    uVar36 = (ulong)uVar23;
    if (abDone[uVar36] == '\0') {
      if ((int)uVar27 < 0) {
        if ((int)(&local_11c)[(int)uVar23] < *(int *)((long)&local_210 + (long)(int)uVar23 * 4 + 4))
        goto LAB_00147e90;
LAB_00147ee0:
        if ((uint)pMVar40 < uVar23) {
          uVar38 = (ulong)(uVar23 - 1);
          iVar17 = (uint)local_270;
        }
        else {
          uVar38 = (ulong)(int)(uVar23 - 1);
          iVar17 = *(int *)(&szCell + uVar38 * 2) + (uint)bVar49;
        }
        uVar23 = local_204[uVar38 - 1] + (uint)bVar49;
        local_280 = (ulong)uVar23;
        uVar23 = local_204[uVar36 - 1] - uVar23;
      }
      else {
        if (uVar27 != 0) goto LAB_00147ee0;
        local_280 = 0;
        iVar17 = 0;
        uVar23 = local_120;
      }
      local_278 = (ulong)uVar23;
      local_130 = uVar36;
      pMVar37 = local_150[uVar36 - 1];
      puVar7 = pMVar37->aData;
      local_228 = (MemPage *)(ulong)pMVar37->hdrOffset;
      local_220 = (MemPage *)(pMVar37->aCellIdx + (int)(uVar23 * 2));
      uVar16 = pMVar37->nCell;
      bVar3 = pMVar37->nOverflow;
      uVar33 = (uint)uVar16;
      iVar19 = (int)local_280;
      local_1f0 = (MemPage *)CONCAT44(local_1f0._4_4_,iVar17);
      iVar43 = iVar17;
      uVar23 = uVar33;
      if (iVar17 < iVar19) {
        iVar43 = pageFreeArray(pMVar37,iVar17,iVar19 - iVar17,(CellArray *)&pChild);
        uVar23 = uVar33 - iVar43;
        if ((int)uVar33 < iVar43) {
          iVar17 = sqlite3CorruptError(0x1129b);
          pCur = local_260;
          pMVar31 = local_250;
          goto LAB_0014752c;
        }
        memmove(pMVar37->aCellIdx,pMVar37->aCellIdx + iVar43 * 2,
                (ulong)((uint)uVar16 + (uint)uVar16));
        iVar43 = (int)local_1f0;
      }
      iVar34 = (uint)uVar16 + iVar43 + (uint)bVar3;
      iFirst = (int)local_278 + (int)local_280;
      nCell = iVar34 - iFirst;
      if (nCell != 0 && iFirst <= iVar34) {
        iVar43 = pageFreeArray(pMVar37,iFirst,nCell,(CellArray *)&pChild);
        uVar23 = uVar23 - iVar43;
        iVar43 = (int)local_1f0;
      }
      local_170.nKey =
           (i64)(puVar7 + (ulong)((ushort)(*(ushort *)(puVar7 + 5 + (long)local_228) << 8 |
                                          *(ushort *)(puVar7 + 5 + (long)local_228) >> 8) - 1 &
                                 0xffff) + 1);
      if ((ulong)local_170.nKey < local_220) {
LAB_0014817f:
        pMVar40 = local_128;
        lVar26 = (long)(int)local_280 * 2;
        for (uVar36 = local_278 & 0xffffffff; 0 < (int)uVar36; uVar36 = (ulong)((int)uVar36 - 1)) {
          if (*(short *)((long)local_288->aiOvfl + lVar26 + -0x1c) == 0) {
            uVar14 = (*local_268->xCellSize)(local_268,*(u8 **)((long)local_230 + lVar26 * 4));
            *(u16 *)((long)local_288->aiOvfl + lVar26 + -0x1c) = uVar14;
          }
          lVar26 = lVar26 + 2;
        }
        iVar17 = rebuildPage((CellArray *)&pChild,(int)local_280,(int)local_278,pMVar37);
        pCur = local_260;
        pMVar31 = local_250;
        if (iVar17 != 0) goto LAB_0014752c;
      }
      else {
        if ((int)local_280 < iVar43) {
          iVar43 = iVar17 - iVar19;
          if ((int)local_278 <= iVar17 - iVar19) {
            iVar43 = (int)local_278;
          }
          puVar35 = pMVar37->aCellIdx;
          memmove(puVar35 + iVar43 * 2,puVar35,(long)(int)(uVar23 * 2));
          iVar17 = pageInsertArray(pMVar37,&local_220->isInit,(u8 **)&local_170,puVar35,
                                   (int)local_280,iVar43,(CellArray *)&pChild);
          if (iVar17 != 0) goto LAB_0014817f;
          uVar23 = uVar23 + iVar43;
          iVar43 = (int)local_1f0;
        }
        uVar38 = 0;
        uVar36 = local_280;
        while( true ) {
          if (pMVar37->nOverflow <= uVar38) break;
          iVar19 = (uint)pMVar37->aiOvfl[uVar38] + iVar43;
          iVar17 = iVar19 - (int)uVar36;
          if ((-1 < iVar17) && (iVar17 < (int)local_278)) {
            puVar35 = pMVar37->aCellIdx + (uint)(iVar17 * 2);
            if (uVar23 - iVar17 != 0 && iVar17 <= (int)uVar23) {
              memmove(puVar35 + 2,puVar35,(long)(int)((uVar23 - iVar17) * 2));
            }
            iVar17 = pageInsertArray(pMVar37,&local_220->isInit,(u8 **)&local_170,puVar35,iVar19,1,
                                     (CellArray *)&pChild);
            if (iVar17 != 0) goto LAB_0014817f;
            uVar23 = uVar23 + 1;
            uVar36 = local_280;
            iVar43 = (int)local_1f0;
          }
          uVar38 = uVar38 + 1;
        }
        iVar17 = pageInsertArray(pMVar37,&local_220->isInit,(u8 **)&local_170,
                                 pMVar37->aCellIdx + (int)(uVar23 * 2),uVar23 + (int)uVar36,
                                 (int)local_278 - uVar23,(CellArray *)&pChild);
        if (iVar17 != 0) goto LAB_0014817f;
        pMVar37->nCell = (u16)local_278;
        pMVar37->nOverflow = '\0';
        (puVar7 + 3)[(long)local_228] = (u8)(local_278 >> 8);
        (puVar7 + 4)[(long)local_228] = (u8)pMVar37->nCell;
        uVar16 = (short)local_170.nKey - (short)puVar7;
        *(ushort *)(puVar7 + 5 + (long)local_228) = uVar16 * 0x100 | uVar16 >> 8;
        pMVar40 = local_128;
      }
      uVar36 = local_130;
      abDone[local_130] = '\x01';
      pMVar37->nFree = (int)local_248 - szNew[uVar36];
    }
  } while( true );
  local_28c = 0;
  if (((local_251 == '\x01') && (local_240->nCell == 0)) &&
     (pMVar40 = (MemPage *)CONCAT44(pNew._4_4_,(int)pNew),
     (int)(uint)local_240->hdrOffset <= pMVar40->nFree)) {
    local_28c = defragmentPage(pMVar40,-1);
    copyNodeContent(pMVar40,local_240,&local_28c);
    freePage(pMVar40,&local_28c);
  }
  else if (bVar2 == 0 && local_238->autoVacuum != '\0') {
    for (pMVar40 = (MemPage *)0x0; pMVar31 != pMVar40; pMVar40 = (MemPage *)&pMVar40->bBusy) {
      pMVar37 = local_150[(long)((long)&pMVar40[-1].xParseCell + 7)];
      uVar18 = sqlite3Get4byte(pMVar37->aData + 8);
      ptrmapPut(local_238,uVar18,'\x05',pMVar37->pgno,&local_28c);
    }
  }
  for (; pCur = local_260, pMVar31 = local_250, iVar17 = local_28c, lVar24 <= (long)pMVar44;
      lVar24 = lVar24 + 1) {
    freePage(apOld[lVar24],&local_28c);
  }
  goto LAB_0014752c;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}